

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assessment_1.cpp
# Opt level: O0

void read_cmd_tokens(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *tokens)

{
  token_code tVar1;
  const_reference pvVar2;
  float fVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_28;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *tokens_local;
  
  local_10 = tokens;
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](tokens,0);
  tVar1 = get_token_code(pvVar2);
  switch(tVar1) {
  case ambient:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_28,tokens);
    record_token_rgb(ca,&local_28);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_28);
    break;
  case diffuse:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_50,tokens);
    record_token_rgb(cr,&local_50);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_50);
    break;
  case specular:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_68,tokens);
    record_token_rgb(cp,&local_68);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_68);
    break;
  case set_pu:
    using_phong = false;
    using_WARD = true;
    using_toon = false;
    using_translucent = false;
    using_sketch = false;
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](tokens,1);
    fVar3 = std::__cxx11::stof(pvVar2,(size_t *)0x0);
    pu = 1.0 / fVar3;
    break;
  case set_pv:
    using_phong = false;
    using_WARD = true;
    using_toon = false;
    using_translucent = false;
    using_sketch = false;
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](tokens,1);
    fVar3 = std::__cxx11::stof(pvVar2,(size_t *)0x0);
    pv = 1.0 / fVar3;
    break;
  case set_p:
    using_phong = true;
    using_WARD = false;
    using_toon = false;
    using_translucent = false;
    using_sketch = false;
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](tokens,1);
    p = std::__cxx11::stoi(pvVar2,(size_t *)0x0,10);
    break;
  case add_dl:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_80,tokens);
    record_token_light(dls,dl_cs,&local_80);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_80);
    break;
  case add_pl:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_98,tokens);
    record_token_light(pls,pl_cs,&local_98);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_98);
    break;
  case toon:
    using_phong = true;
    using_WARD = false;
    using_toon = true;
    using_translucent = false;
    using_sketch = false;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_b0,tokens);
    record_token_rgb(cc1,&local_b0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_b0);
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](tokens,4);
    cc2[0] = std::__cxx11::stof(pvVar2,(size_t *)0x0);
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](tokens,5);
    cc2[1] = std::__cxx11::stof(pvVar2,(size_t *)0x0);
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](tokens,6);
    cc2[2] = std::__cxx11::stof(pvVar2,(size_t *)0x0);
    break;
  case set_toon_layers:
    using_phong = true;
    using_WARD = false;
    using_toon = true;
    using_translucent = false;
    using_sketch = false;
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](tokens,1);
    toonl = std::__cxx11::stof(pvVar2,(size_t *)0x0);
    break;
  case set_depth:
    using_translucent = true;
    using_phong = false;
    using_WARD = false;
    using_toon = false;
    using_sketch = false;
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](tokens,1);
    depth = std::__cxx11::stof(pvVar2,(size_t *)0x0);
    break;
  case set_dd:
    using_translucent = true;
    using_phong = false;
    using_WARD = false;
    using_toon = false;
    using_sketch = false;
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](tokens,1);
    dd = std::__cxx11::stof(pvVar2,(size_t *)0x0);
    break;
  case set_ds:
    using_translucent = true;
    using_phong = false;
    using_WARD = false;
    using_toon = false;
    using_sketch = false;
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](tokens,1);
    ds = std::__cxx11::stof(pvVar2,(size_t *)0x0);
    break;
  case set_sketch:
    using_sketch = true;
    using_translucent = false;
    using_phong = false;
    using_WARD = false;
    using_toon = false;
    vec2_norm(line_dir,line_dir);
  }
  return;
}

Assistant:

void read_cmd_tokens(const vector<string> tokens){

    switch (get_token_code(tokens[0])) {
        case ambient:
            record_token_rgb(ca, tokens);
            break;

        case diffuse:
            record_token_rgb(cr, tokens);
            break;
        
        case specular:
            record_token_rgb(cp, tokens);
            break;

        case set_pu:
            using_phong = false;
            using_WARD = true;
            using_toon = false;
            using_translucent = false;
            using_sketch = false;
            pu = 1.0f/stof(tokens[1]);
            break;
        
        case set_pv:
            using_phong = false;
            using_WARD = true;
            using_toon = false;
            using_translucent = false;
            using_sketch = false;
            pv = 1.0f/stof(tokens[1]);
            break;
        
        case set_p:
            using_phong = true;
            using_WARD = false;
            using_toon = false;
            using_translucent = false;
            using_sketch = false;
            p = stoi(tokens[1]);
            break;

        case add_dl:
            record_token_light(dls, dl_cs, tokens);
            break;

        case add_pl:
            record_token_light(pls, pl_cs, tokens);
            break;

        case toon:
            using_phong = true;
            using_WARD = false;
            using_toon = true;
            using_translucent = false;
            using_sketch = false;
            record_token_rgb(cc1, tokens);
            cc2[0] = stof(tokens[4]);
            cc2[1] = stof(tokens[5]);
            cc2[2] = stof(tokens[6]);
            break;

        case set_toon_layers:
            using_phong = true;
            using_WARD = false;
            using_toon = true;
            using_translucent = false;
            using_sketch = false;
            toonl = stof(tokens[1]);
            break;

        case set_depth:
            using_translucent = true;
            using_phong = false;
            using_WARD = false;
            using_toon = false;
            using_sketch = false;
            depth = stof(tokens[1]);
            break;

        case set_dd:
            using_translucent = true;
            using_phong = false;
            using_WARD = false;
            using_toon = false;
            using_sketch = false;
            dd = stof(tokens[1]);
            break;

        case set_ds:
            using_translucent = true;
            using_phong = false;
            using_WARD = false;
            using_toon = false;
            using_sketch = false;
            ds = stof(tokens[1]);
            break;

        case set_sketch:
            using_sketch = true;
            using_translucent = false;
            using_phong = false;
            using_WARD = false;
            using_toon = false;
            vec2_norm(line_dir, line_dir); //normalize line direction for sketch
            break;

        default:
            break;
    }

}